

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MCU::idct(MCU *this)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  void *extraout_RDX_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_448;
  int local_444;
  int j_2;
  int i_1;
  int x_1;
  int j_1;
  int i;
  int y;
  int x;
  int j;
  double s [8] [8];
  double tmp [8] [8];
  int local_1c;
  int local_18;
  int w;
  int h;
  int id;
  MCU *this_local;
  
  for (w = 1; w < 4; w = w + 1) {
    for (local_18 = 0; local_18 < (int)(uint)subVector[w].height; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < (int)(uint)subVector[w].width; local_1c = local_1c + 1) {
        memset(s[7] + 7,0,0x200);
        memset(&x,0,0x200);
        pvVar1 = extraout_RDX;
        for (y = 0; y < 8; y = y + 1) {
          for (i = 0; i < 8; i = i + 1) {
            for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
              c(this,(void *)(ulong)(uint)j_1,pvVar1);
              *(double *)(&x + (long)y * 0x10 + (long)i * 2) =
                   extraout_XMM0_Qa * this->mcu[w][local_18][local_1c][i][j_1] *
                   cos_cache[(y * 2 + 1) * j_1] + *(double *)(&x + (long)y * 0x10 + (long)i * 2);
              pvVar1 = extraout_RDX_00;
            }
            *(double *)(&x + (long)y * 0x10 + (long)i * 2) =
                 *(double *)(&x + (long)y * 0x10 + (long)i * 2) / 2.0;
          }
        }
        for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
          for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
            for (j_2 = 0; j_2 < 8; j_2 = j_2 + 1) {
              c(this,(void *)(ulong)(uint)j_2,pvVar1);
              s[(long)x_1 + 7][(long)i_1 + 7] =
                   extraout_XMM0_Qa_00 * *(double *)(&x + (long)i_1 * 0x10 + (long)j_2 * 2) *
                   cos_cache[(x_1 * 2 + 1) * j_2] + s[(long)x_1 + 7][(long)i_1 + 7];
              pvVar1 = extraout_RDX_01;
            }
            s[(long)x_1 + 7][(long)i_1 + 7] = s[(long)x_1 + 7][(long)i_1 + 7] / 2.0;
          }
        }
        for (local_444 = 0; local_444 < 8; local_444 = local_444 + 1) {
          for (local_448 = 0; local_448 < 8; local_448 = local_448 + 1) {
            this->mcu[w][local_18][local_1c][local_444][local_448] =
                 s[(long)local_444 + 7][(long)local_448 + 7];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void idct() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    double tmp[8][8] = {0};
//					 照定義展開，效能低下
//                     for (int i = 0; i < 8; i++) {
//                         for (int j = 0; j < 8; j++) {
//                             for (int x = 0; x < 8; x++) {
//                                 for (int y = 0; y < 8; y++) {
//                                     tmp[i][j] += (cc(x, y) * mcu[id][h][w][x][y] * cos((2*i+1)*M_PI/16.0*x) * cos((2*j+1)*M_PI/16.0*y));
//                                 }
//                             }
//                             tmp[i][j] /= 4.0;
//                         }
//                     }
					// 計算兩次一維idct去計算二維idct
                    double s[8][8] = {};
                    for (int j = 0; j < 8; j++) {
                        for (int x = 0; x < 8; x++) {
                            for (int y = 0; y < 8; y++) {
                                s[j][x] += c (y) * mcu[id][h][w][x][y] * cos_cache[(j + j + 1) * y];
                            }
                            s[j][x] = s[j][x] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            for (int x = 0; x < 8; x++) {
                                tmp[i][j] += c(x) * s[j][x] * cos_cache[(i + i + 1) * x];
                            }
                            tmp[i][j] = tmp[i][j] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = tmp[i][j];
                        }
                    }
                }
            }
        }
    }